

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O2

void __thiscall test_app::test_objects(test_app *this)

{
  _Base_ptr *pp_Var1;
  long lVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  cache_interface *pcVar6;
  string *psVar7;
  size_type sVar8;
  runtime_error *prVar9;
  allocator local_289;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t1;
  mydata d_2;
  mydata d;
  ostringstream oss;
  size_type sStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  size_type *local_1d8;
  long local_1d0;
  allocator local_71;
  triggers_recorder tr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [3];
  
  poVar5 = std::operator<<((ostream *)&std::cout,"- Data Object");
  std::endl<char,std::char_traits<char>>(poVar5);
  set_context(this,false);
  poVar5 = std::operator<<((ostream *)&std::cout,"-- With Triggers Full API");
  std::endl<char,std::char_traits<char>>(poVar5);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d.x = 1;
  d.y = 2;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t1._M_t._M_impl.super__Rb_tree_header._M_header;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t2._M_t._M_impl.super__Rb_tree_header._M_header;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&oss,"k1",(allocator *)&d_2);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&t1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&oss,"k2",(allocator *)&d_2);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&t2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",&local_289);
  std::__cxx11::string::string((string *)&d_2,"bar",&local_71);
  cppcms::cache_interface::store_frame(psVar7,(string *)&oss,(set *)&d_2,(int)&t1,true);
  std::__cxx11::string::~string((string *)&d_2);
  std::__cxx11::string::~string((string *)&oss);
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&d_2);
  cppcms::cache_interface::store_data<mydata>(pcVar6,(string *)&oss,&d,&t2,-1,false);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xaf);
    std::operator<<(poVar5," tr.detach().size()==4");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&t2._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&t1._M_t);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d.x = 0;
  d.y = 0;
  pp_Var1 = &t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  t2._M_t._M_impl._0_8_ = pp_Var1;
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t1);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t2,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xb6);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t1);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d,false);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xb7);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d.x != 1) || (d.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xb8);
    std::operator<<(poVar5," d.x==1 && d.y==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t2,
                          "bar");
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xb9);
    std::operator<<(poVar5," tmp==\"bar\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  if (t1._M_t._M_impl.super__Rb_tree_header._M_node_count != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xbb);
    std::operator<<(poVar5," tg.size()==4");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xbc);
    std::operator<<(poVar5," tg.count(\"foo\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xbd);
    std::operator<<(poVar5," tg.count(\"dat\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"k1",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xbe);
    std::operator<<(poVar5," tg.count(\"k1\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"k2",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xbf);
    std::operator<<(poVar5," tg.count(\"k2\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&t1._M_t);
  std::__cxx11::string::~string((string *)&t2);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d_2.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d_2.x = 0;
  d_2.y = 0;
  t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t2);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xc6);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t2);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,true);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,199);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d_2.x != 1) || (d_2.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,200);
    std::operator<<(poVar5," d.x==1 && d.y==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t1,
                          "bar");
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xc9);
    std::operator<<(poVar5," tmp==\"bar\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xca);
    std::operator<<(poVar5," tr.detach().size()==0");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&t1);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  t2._M_t._M_impl._0_8_ = &PTR_load_00119c88;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 5;
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&d_2);
  std::__cxx11::string::string((string *)&t1,"baz",(allocator *)&d);
  cppcms::cache_interface::store_frame(psVar7,(string *)&oss,(int)&t1,true);
  std::__cxx11::string::~string((string *)&t1);
  std::__cxx11::string::~string((string *)&oss);
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t1);
  cppcms::cache_interface::store_data<mydata>(pcVar6,(string *)&oss,(mydata *)&t2,-1,false);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (local_1d0 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd2);
    std::operator<<(poVar5," tr.detach().size()==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d.x = 0;
  d.y = 0;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  t2._M_t._M_impl._0_8_ = pp_Var1;
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t1);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t2,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd9);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t1);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d,false);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xda);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d.x != 4) || (d.y != 5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdb);
    std::operator<<(poVar5," d.x==4 && d.y==5");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t2,
                          "baz");
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdc);
    std::operator<<(poVar5," tmp==\"baz\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  if (t1._M_t._M_impl.super__Rb_tree_header._M_node_count != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xde);
    std::operator<<(poVar5," tg.size()==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdf);
    std::operator<<(poVar5," tg.count(\"foo\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&d_2);
  sVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&t1,(key_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (sVar8 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xe0);
    std::operator<<(poVar5," tg.count(\"dat\")==1");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&d_2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&t1._M_t);
  std::__cxx11::string::~string((string *)&t2);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Without Triggers");
  std::endl<char,std::char_traits<char>>(poVar5);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d_2.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d_2.x = 1;
  d_2.y = 2;
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&t1,"foo",(allocator *)&d);
  std::__cxx11::string::string((string *)&t2,"bar",&local_289);
  _oss = (pointer)0x0;
  sStack_1f0 = 0;
  local_1e8._M_allocated_capacity = 0;
  local_1d0 = 0;
  local_1e8._8_8_ = &sStack_1f0;
  local_1d8 = &sStack_1f0;
  cppcms::cache_interface::store_frame(psVar7,(string *)&t1,(set *)&t2,(int)&oss,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&t1,"dat",(allocator *)&t2);
  _oss = (pointer)0x0;
  sStack_1f0 = 0;
  local_1e8._M_allocated_capacity = 0;
  local_1d0 = 0;
  local_1e8._8_8_ = &sStack_1f0;
  local_1d8 = &sStack_1f0;
  cppcms::cache_interface::store_data<mydata>
            (pcVar6,(string *)&t1,&d_2,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&oss,-1,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  std::__cxx11::string::~string((string *)&t1);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xec);
    std::operator<<(poVar5," tr.detach().size()==0");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d_2.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d_2.x = 0;
  d_2.y = 0;
  t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t2);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf3);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t2);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,true);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf4);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d_2.x != 1) || (d_2.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf5);
    std::operator<<(poVar5," d.x==1 && d.y==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t1,
                          "bar");
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf6);
    std::operator<<(poVar5," tmp==\"bar\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf7);
    std::operator<<(poVar5," tr.detach().size()==0");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&t1);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d_2.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d_2.x = 0;
  d_2.y = 0;
  t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t2);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xfe);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t2);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,false);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xff);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d_2.x != 1) || (d_2.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x100);
    std::operator<<(poVar5," d.x==1 && d.y==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t1,
                          "bar");
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x101);
    std::operator<<(poVar5," tmp==\"bar\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x102);
    std::operator<<(poVar5," tr.detach().size()==2");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&t1);
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  t2._M_t._M_impl._0_8_ = &PTR_load_00119c88;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 5;
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&d_2);
  std::__cxx11::string::string((string *)&t1,"baz",(allocator *)&d);
  cppcms::cache_interface::store_frame(psVar7,(string *)&oss,(int)&t1,true);
  std::__cxx11::string::~string((string *)&t1);
  std::__cxx11::string::~string((string *)&oss);
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t1);
  cppcms::cache_interface::store_data<mydata>(pcVar6,(string *)&oss,(mydata *)&t2,-1,true);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::triggers_recorder::detach_abi_cxx11_();
  lVar2 = local_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&oss);
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x10a);
    std::operator<<(poVar5," tr.detach().size()==0");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t1);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder(&tr);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar6 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder(&tr,pcVar6);
  d_2.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00119c88;
  d_2.x = 0;
  d_2.y = 0;
  t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar7 = (string *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&t2);
  cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
  std::__cxx11::string::~string((string *)&oss);
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x111);
    std::operator<<(poVar5," cache().fetch_frame(\"foo\",tmp,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = (cache_interface *)cppcms::application::cache();
  std::__cxx11::string::string((string *)&oss,"dat",(allocator *)&t2);
  bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,true);
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x112);
    std::operator<<(poVar5," cache().fetch_data(\"dat\",d,true)");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((d_2.x == 4) && (d_2.y == 5)) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t1
                            ,"baz");
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x114);
      std::operator<<(poVar5," tmp==\"baz\"");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::triggers_recorder::detach_abi_cxx11_();
    lVar2 = local_1d0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&oss);
    if (lVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x115);
      std::operator<<(poVar5," tr.detach().size()==0");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&t1);
    cppcms::triggers_recorder::~triggers_recorder(&tr);
    cppcms::application::cache();
    cppcms::cache_interface::clear();
    poVar5 = std::operator<<((ostream *)&std::cout,"-- Timeouts");
    std::endl<char,std::char_traits<char>>(poVar5);
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    t2._M_t._M_impl._0_8_ = &PTR_load_00119c88;
    t2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
    t2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 2;
    d_2.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00119c88;
    d_2.x = 4;
    d_2.y = 5;
    psVar7 = (string *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&tr,"foo1",(allocator *)&d);
    std::__cxx11::string::string((string *)&t1,"baz1",&local_289);
    _oss = (pointer)0x0;
    sStack_1f0 = 0;
    local_1e8._M_allocated_capacity = 0;
    local_1d0 = 0;
    local_1e8._8_8_ = &sStack_1f0;
    local_1d8 = &sStack_1f0;
    cppcms::cache_interface::store_frame(psVar7,(string *)&tr,(set *)&t1,(int)&oss,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&oss);
    std::__cxx11::string::~string((string *)&t1);
    std::__cxx11::string::~string((string *)&tr);
    pcVar6 = (cache_interface *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&tr,"dat1",(allocator *)&t1);
    _oss = (pointer)0x0;
    sStack_1f0 = 0;
    local_1e8._M_allocated_capacity = 0;
    local_1d0 = 0;
    local_1e8._8_8_ = &sStack_1f0;
    local_1d8 = &sStack_1f0;
    cppcms::cache_interface::store_data<mydata>
              (pcVar6,(string *)&tr,(mydata *)&t2,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&oss,2,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&oss);
    std::__cxx11::string::~string((string *)&tr);
    psVar7 = (string *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"foo2",(allocator *)&t1);
    std::__cxx11::string::string((string *)&tr,"baz2",(allocator *)&d);
    cppcms::cache_interface::store_frame(psVar7,(string *)&oss,(int)&tr,true);
    std::__cxx11::string::~string((string *)&tr);
    std::__cxx11::string::~string((string *)&oss);
    pcVar6 = (cache_interface *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"dat2",(allocator *)&tr);
    cppcms::cache_interface::store_data<mydata>(pcVar6,(string *)&oss,&d_2,2,true);
    std::__cxx11::string::~string((string *)&oss);
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    d_2.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00119c88;
    d_2.x = 0;
    d_2.y = 0;
    d.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00119c88;
    d.x = 0;
    d.y = 0;
    local_60[0]._M_local_buf[0] = '\0';
    t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
    _tr = (pointer)local_60;
    psVar7 = (string *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"foo1",(allocator *)&t2);
    cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&tr,0));
    std::__cxx11::string::~string((string *)&oss);
    if (cVar3 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x128);
      std::operator<<(poVar5," cache().fetch_frame(\"foo1\",t1,true)");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar7 = (string *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"foo2",(allocator *)&t2);
    cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
    std::__cxx11::string::~string((string *)&oss);
    if (cVar3 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x129);
      std::operator<<(poVar5," cache().fetch_frame(\"foo2\",t2,true)");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (cache_interface *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"dat1",(allocator *)&t2);
    bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,true);
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x12a);
      std::operator<<(poVar5," cache().fetch_data(\"dat1\",d1,true)");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (cache_interface *)cppcms::application::cache();
    std::__cxx11::string::string((string *)&oss,"dat2",(allocator *)&t2);
    bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d,true);
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,299);
      std::operator<<(poVar5," cache().fetch_data(\"dat2\",d2,true)");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((d_2.x != 1) || (d_2.y != 2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,300);
      std::operator<<(poVar5," d1.x==1 && d1.y==2");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((d.x == 4) && (d.y == 5)) {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tr,"baz1");
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x12e);
        std::operator<<(poVar5," t1==\"baz1\"");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&t2);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &t1,"baz2");
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x12f);
        std::operator<<(poVar5," t2==\"baz2\"");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&t2);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string((string *)&t1);
      std::__cxx11::string::~string((string *)&tr);
      booster::ptime::millisleep(3000);
      cppcms::application::cache();
      cppcms::cache_interface::reset();
      d_2.super_serializable.super_serializable_base._vptr_serializable_base =
           (serializable_base)&PTR_load_00119c88;
      d_2.x = 0;
      d_2.y = 0;
      d.super_serializable.super_serializable_base._vptr_serializable_base =
           (serializable_base)&PTR_load_00119c88;
      d.x = 0;
      d.y = 0;
      local_60[0]._M_local_buf[0] = '\0';
      t1._M_t._M_impl._0_8_ = &t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      t1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)t1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
      _tr = (pointer)local_60;
      psVar7 = (string *)cppcms::application::cache();
      std::__cxx11::string::string((string *)&oss,"foo1",(allocator *)&t2);
      cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&tr,0));
      std::__cxx11::string::~string((string *)&oss);
      if (cVar3 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x136);
        std::operator<<(poVar5," !cache().fetch_frame(\"foo1\",t1,true)");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&t2);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      psVar7 = (string *)cppcms::application::cache();
      std::__cxx11::string::string((string *)&oss,"foo2",(allocator *)&t2);
      cVar3 = cppcms::cache_interface::fetch_frame(psVar7,(string *)&oss,SUB81(&t1,0));
      std::__cxx11::string::~string((string *)&oss);
      if (cVar3 == '\0') {
        pcVar6 = (cache_interface *)cppcms::application::cache();
        std::__cxx11::string::string((string *)&oss,"dat1",(allocator *)&t2);
        bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d_2,true);
        std::__cxx11::string::~string((string *)&oss);
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar5 = std::operator<<((ostream *)&oss,"Error ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x138);
          std::operator<<(poVar5," !cache().fetch_data(\"dat1\",d1,true)");
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar9,(string *)&t2);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar6 = (cache_interface *)cppcms::application::cache();
        std::__cxx11::string::string((string *)&oss,"dat2",(allocator *)&t2);
        bVar4 = cppcms::cache_interface::fetch_data<mydata>(pcVar6,(string *)&oss,&d,true);
        std::__cxx11::string::~string((string *)&oss);
        if (!bVar4) {
          std::__cxx11::string::~string((string *)&t1);
          std::__cxx11::string::~string((string *)&tr);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x139);
        std::operator<<(poVar5," !cache().fetch_data(\"dat2\",d2,true)");
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&t2);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x137);
      std::operator<<(poVar5," !cache().fetch_frame(\"foo2\",t2,true)");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&t2);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x12d);
    std::operator<<(poVar5," d2.x==4 && d2.y==5");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&t2);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar5 = std::operator<<((ostream *)&oss,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x113);
  std::operator<<(poVar5," d.x==4 && d.y==5");
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,(string *)&t2);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_objects()
	{
		std::cout << "- Data Object" << std::endl;
		set_context(false);

		{
			std::cout << "-- With Triggers Full API" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				std::set<std::string> t1,t2;
				t1.insert("k1");
				t2.insert("k2");
				cache().store_frame("foo","bar",t1);
				cache().store_data("dat",d,t2);
				TEST(tr.detach().size()==4);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==4);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
				TEST(tg.count("k1")==1);
				TEST(tg.count("k2")==1);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1);
				cache().store_data("dat",d,-1);
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==2);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
			}
		}
		cache().clear();
		{
			std::cout << "-- Without Triggers" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				cache().store_frame("foo","bar",std::set<std::string>(),-1,true);
				cache().store_data("dat",d,std::set<std::string>(),-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1,true);
				cache().store_data("dat",d,-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				TEST(tr.detach().size()==0);
			}
		}
		cache().clear();
		{
			std::cout << "-- Timeouts" << std::endl;
			{
				cache().reset();
				mydata d1(1,2);
				mydata d2(4,5);
				cache().store_frame("foo1","baz1",std::set<std::string>(),2,true);
				cache().store_data("dat1",d1,std::set<std::string>(),2,true);
				cache().store_frame("foo2","baz2",2,true);
				cache().store_data("dat2",d2,2,true);
			}
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(cache().fetch_frame("foo1",t1,true));
				TEST(cache().fetch_frame("foo2",t2,true));
				TEST(cache().fetch_data("dat1",d1,true));
				TEST(cache().fetch_data("dat2",d2,true));
				TEST(d1.x==1  && d1.y==2);
				TEST(d2.x==4  && d2.y==5);
				TEST(t1=="baz1");
				TEST(t2=="baz2");
			}
			booster::ptime::millisleep(3000);
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(!cache().fetch_frame("foo1",t1,true));
				TEST(!cache().fetch_frame("foo2",t2,true));
				TEST(!cache().fetch_data("dat1",d1,true));
				TEST(!cache().fetch_data("dat2",d2,true));
			}
		}


	}